

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfa.h
# Opt level: O3

vector<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>
* spvtools::CFA<spvtools::val::BasicBlock>::CalculateDominators
            (vector<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>
             *__return_storage_ptr__,
            vector<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
            *postorder,get_blocks_func *predecessor_func)

{
  pointer ppBVar1;
  BasicBlock *pBVar2;
  iterator __position;
  __normal_iterator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_*,_std::vector<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>_>
  __first;
  __normal_iterator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_*,_std::vector<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>_>
  __last;
  vector<std::pair<spvtools::val::BasicBlock*,spvtools::val::BasicBlock*>,std::allocator<std::pair<spvtools::val::BasicBlock*,spvtools::val::BasicBlock*>>>
  *this;
  bool bVar3;
  mapped_type *pmVar4;
  pointer ppBVar5;
  vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> *pvVar6;
  __normal_iterator<spvtools::val::BasicBlock_*const_*,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>
  _Var7;
  _Hash_node_base *p_Var8;
  ulong uVar9;
  __hash_code __code;
  pointer ppBVar10;
  _Any_data *p_Var11;
  _Hash_node_base *p_Var12;
  size_t sVar13;
  size_t sVar14;
  size_t sVar15;
  long lVar16;
  pointer ppBVar17;
  __node_base _Var18;
  BasicBlock *idom;
  BasicBlock *p;
  unordered_map<const_spvtools::val::BasicBlock_*,_block_detail,_std::hash<const_spvtools::val::BasicBlock_*>,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>_>_>
  idoms;
  pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*> local_a0;
  pointer local_90;
  _Any_data *local_88;
  _Hash_node_base *local_80;
  vector<std::pair<spvtools::val::BasicBlock*,spvtools::val::BasicBlock*>,std::allocator<std::pair<spvtools::val::BasicBlock*,spvtools::val::BasicBlock*>>>
  *local_78;
  BasicBlock *local_70;
  _Hashtable<const_spvtools::val::BasicBlock_*,_std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>,_std::allocator<std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>_>,_std::__detail::_Select1st,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::hash<const_spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  ppBVar10 = (postorder->
             super__Vector_base<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
             )._M_impl.super__Vector_impl_data._M_start;
  ppBVar5 = (postorder->
            super__Vector_base<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  p_Var12 = (_Hash_node_base *)((long)ppBVar5 - (long)ppBVar10 >> 3);
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  local_88 = (_Any_data *)predecessor_func;
  local_78 = (vector<std::pair<spvtools::val::BasicBlock*,spvtools::val::BasicBlock*>,std::allocator<std::pair<spvtools::val::BasicBlock*,spvtools::val::BasicBlock*>>>
              *)__return_storage_ptr__;
  if (ppBVar5 != ppBVar10) {
    lVar16 = 0;
    sVar14 = 0;
    do {
      pmVar4 = std::__detail::
               _Map_base<const_spvtools::val::BasicBlock_*,_std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>,_std::allocator<std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>_>,_std::__detail::_Select1st,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::hash<const_spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<const_spvtools::val::BasicBlock_*,_std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>,_std::allocator<std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>_>,_std::__detail::_Select1st,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::hash<const_spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&local_68,(key_type *)((long)ppBVar10 + lVar16));
      pmVar4->dominator = (size_t)p_Var12;
      pmVar4->postorder_index = sVar14;
      sVar14 = sVar14 + 1;
      ppBVar10 = (postorder->
                 super__Vector_base<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      ppBVar5 = (postorder->
                super__Vector_base<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      lVar16 = lVar16 + 8;
    } while (sVar14 < (ulong)((long)ppBVar5 - (long)ppBVar10 >> 3));
  }
  pmVar4 = std::__detail::
           _Map_base<const_spvtools::val::BasicBlock_*,_std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>,_std::allocator<std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>_>,_std::__detail::_Select1st,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::hash<const_spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<const_spvtools::val::BasicBlock_*,_std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>,_std::allocator<std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>_>,_std::__detail::_Select1st,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::hash<const_spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&local_68,ppBVar5 + -1);
  sVar14 = pmVar4->postorder_index;
  pmVar4 = std::__detail::
           _Map_base<const_spvtools::val::BasicBlock_*,_std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>,_std::allocator<std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>_>,_std::__detail::_Select1st,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::hash<const_spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<const_spvtools::val::BasicBlock_*,_std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>,_std::allocator<std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>_>,_std::__detail::_Select1st,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::hash<const_spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&local_68,
                        (postorder->
                        super__Vector_base<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
                        )._M_impl.super__Vector_impl_data._M_finish + -1);
  pmVar4->dominator = sVar14;
  ppBVar10 = (postorder->
             super__Vector_base<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
             )._M_impl.super__Vector_impl_data._M_start;
  p_Var11 = local_88;
  local_80 = p_Var12;
  do {
    ppBVar5 = (postorder->
              super__Vector_base<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
              )._M_impl.super__Vector_impl_data._M_finish + -1;
    if (ppBVar5 == ppBVar10) break;
    bVar3 = false;
    do {
      local_a0.first = ppBVar5[-1];
      if (*(long *)(p_Var11 + 1) == 0) {
        std::__throw_bad_function_call();
      }
      local_90 = ppBVar5 + -1;
      pvVar6 = (**(code **)(p_Var11->_M_pod_data + 0x18))(p_Var11,&local_a0.first);
      _Var7 = std::
              __find_if<__gnu_cxx::__normal_iterator<spvtools::val::BasicBlock*const*,std::vector<spvtools::val::BasicBlock*,std::allocator<spvtools::val::BasicBlock*>>>,__gnu_cxx::__ops::_Iter_pred<spvtools::CFA<spvtools::val::BasicBlock>::CalculateDominators(std::vector<spvtools::val::BasicBlock_const*,std::allocator<spvtools::val::BasicBlock_const*>>const&,std::function<std::vector<spvtools::val::BasicBlock*,std::allocator<spvtools::val::BasicBlock*>>const*(spvtools::val::BasicBlock_const*)>)::_lambda(spvtools::val::BasicBlock*)_1_>>
                        ((pvVar6->
                         super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                         )._M_impl.super__Vector_impl_data._M_start,
                         (pvVar6->
                         super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                         )._M_impl.super__Vector_impl_data._M_finish,&local_68,p_Var12);
      if (_Var7._M_current !=
          (pvVar6->
          super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
          )._M_impl.super__Vector_impl_data._M_finish) {
        local_a0.first = *_Var7._M_current;
        pmVar4 = std::__detail::
                 _Map_base<const_spvtools::val::BasicBlock_*,_std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>,_std::allocator<std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>_>,_std::__detail::_Select1st,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::hash<const_spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<const_spvtools::val::BasicBlock_*,_std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>,_std::allocator<std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>_>,_std::__detail::_Select1st,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::hash<const_spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&local_68,&local_a0.first);
        sVar14 = pmVar4->postorder_index;
        ppBVar1 = (pvVar6->
                  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
        for (ppBVar17 = (pvVar6->
                        super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                        )._M_impl.super__Vector_impl_data._M_start; ppBVar17 != ppBVar1;
            ppBVar17 = ppBVar17 + 1) {
          local_70 = *ppBVar17;
          if (local_a0.first != local_70) {
            if (local_68._M_buckets[(ulong)local_70 % local_68._M_bucket_count] !=
                (__node_base_ptr)0x0) {
              p_Var12 = local_68._M_buckets[(ulong)local_70 % local_68._M_bucket_count]->_M_nxt;
              pBVar2 = (BasicBlock *)p_Var12[1]._M_nxt;
              while (local_70 != pBVar2) {
                p_Var12 = p_Var12->_M_nxt;
                if ((p_Var12 == (_Hash_node_base *)0x0) ||
                   (pBVar2 = (BasicBlock *)p_Var12[1]._M_nxt,
                   (ulong)pBVar2 % local_68._M_bucket_count !=
                   (ulong)local_70 % local_68._M_bucket_count)) goto LAB_002bfbf7;
              }
              pmVar4 = std::__detail::
                       _Map_base<const_spvtools::val::BasicBlock_*,_std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>,_std::allocator<std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>_>,_std::__detail::_Select1st,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::hash<const_spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::operator[]((_Map_base<const_spvtools::val::BasicBlock_*,_std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>,_std::allocator<std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>_>,_std::__detail::_Select1st,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::hash<const_spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                     *)&local_68,&local_70);
              if ((_Hash_node_base *)pmVar4->dominator != local_80) {
                pmVar4 = std::__detail::
                         _Map_base<const_spvtools::val::BasicBlock_*,_std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>,_std::allocator<std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>_>,_std::__detail::_Select1st,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::hash<const_spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         ::operator[]((_Map_base<const_spvtools::val::BasicBlock_*,_std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>,_std::allocator<std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>_>,_std::__detail::_Select1st,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::hash<const_spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                       *)&local_68,&local_70);
                sVar13 = sVar14;
                sVar15 = pmVar4->postorder_index;
                while (sVar15 != sVar13) {
                  while (sVar14 = sVar15, sVar14 < sVar13) {
                    pmVar4 = std::__detail::
                             _Map_base<const_spvtools::val::BasicBlock_*,_std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>,_std::allocator<std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>_>,_std::__detail::_Select1st,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::hash<const_spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             ::operator[]((_Map_base<const_spvtools::val::BasicBlock_*,_std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>,_std::allocator<std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>_>,_std::__detail::_Select1st,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::hash<const_spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                           *)&local_68,
                                          (postorder->
                                          super__Vector_base<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
                                          )._M_impl.super__Vector_impl_data._M_start + sVar14);
                    sVar15 = pmVar4->dominator;
                  }
                  while (sVar15 = sVar14, sVar13 < sVar14) {
                    pmVar4 = std::__detail::
                             _Map_base<const_spvtools::val::BasicBlock_*,_std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>,_std::allocator<std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>_>,_std::__detail::_Select1st,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::hash<const_spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             ::operator[]((_Map_base<const_spvtools::val::BasicBlock_*,_std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>,_std::allocator<std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>_>,_std::__detail::_Select1st,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::hash<const_spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                           *)&local_68,
                                          (postorder->
                                          super__Vector_base<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
                                          )._M_impl.super__Vector_impl_data._M_start + sVar13);
                    sVar13 = pmVar4->dominator;
                  }
                }
              }
            }
          }
LAB_002bfbf7:
        }
        pmVar4 = std::__detail::
                 _Map_base<const_spvtools::val::BasicBlock_*,_std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>,_std::allocator<std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>_>,_std::__detail::_Select1st,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::hash<const_spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<const_spvtools::val::BasicBlock_*,_std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>,_std::allocator<std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>_>,_std::__detail::_Select1st,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::hash<const_spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&local_68,local_90);
        p_Var11 = local_88;
        p_Var12 = local_80;
        if (pmVar4->dominator != sVar14) {
          pmVar4 = std::__detail::
                   _Map_base<const_spvtools::val::BasicBlock_*,_std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>,_std::allocator<std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>_>,_std::__detail::_Select1st,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::hash<const_spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<const_spvtools::val::BasicBlock_*,_std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>,_std::allocator<std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>_>,_std::__detail::_Select1st,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::hash<const_spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)&local_68,local_90);
          pmVar4->dominator = sVar14;
          bVar3 = true;
          p_Var11 = local_88;
          p_Var12 = local_80;
        }
      }
      ppBVar5 = local_90;
    } while (local_90 !=
             (postorder->
             super__Vector_base<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
             )._M_impl.super__Vector_impl_data._M_start);
    ppBVar10 = local_90;
  } while (bVar3);
  this = local_78;
  *(undefined8 *)local_78 = 0;
  *(undefined8 *)(local_78 + 8) = 0;
  *(undefined8 *)(local_78 + 0x10) = 0;
  if (local_68._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    _Var18._M_nxt = local_68._M_before_begin._M_nxt;
    do {
      p_Var8 = _Var18._M_nxt[2]._M_nxt;
      if (p_Var8 == p_Var12) {
        p_Var8 = _Var18._M_nxt[3]._M_nxt;
      }
      local_a0.first = (BasicBlock *)_Var18._M_nxt[1]._M_nxt;
      local_a0.second =
           (postorder->
           super__Vector_base<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
           )._M_impl.super__Vector_impl_data._M_start[(long)p_Var8];
      __position._M_current =
           *(pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*> **)(this + 8);
      if (__position._M_current ==
          *(pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*> **)(this + 0x10)) {
        std::
        vector<std::pair<spvtools::val::BasicBlock*,spvtools::val::BasicBlock*>,std::allocator<std::pair<spvtools::val::BasicBlock*,spvtools::val::BasicBlock*>>>
        ::_M_realloc_insert<std::pair<spvtools::val::BasicBlock*,spvtools::val::BasicBlock*>>
                  (this,__position,&local_a0);
      }
      else {
        (__position._M_current)->first = local_a0.first;
        (__position._M_current)->second = local_a0.second;
        *(long *)(this + 8) = *(long *)(this + 8) + 0x10;
      }
      _Var18._M_nxt = (_Var18._M_nxt)->_M_nxt;
    } while (_Var18._M_nxt != (_Hash_node_base *)0x0);
    __first._M_current = *(pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*> **)this;
    __last._M_current =
         *(pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*> **)(this + 8);
    if (__first._M_current != __last._M_current) {
      uVar9 = (long)__last._M_current - (long)__first._M_current >> 4;
      lVar16 = 0x3f;
      if (uVar9 != 0) {
        for (; uVar9 >> lVar16 == 0; lVar16 = lVar16 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<spvtools::val::BasicBlock*,spvtools::val::BasicBlock*>*,std::vector<std::pair<spvtools::val::BasicBlock*,spvtools::val::BasicBlock*>,std::allocator<std::pair<spvtools::val::BasicBlock*,spvtools::val::BasicBlock*>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<spvtools::CFA<spvtools::val::BasicBlock>::CalculateDominators(std::vector<spvtools::val::BasicBlock_const*,std::allocator<spvtools::val::BasicBlock_const*>>const&,std::function<std::vector<spvtools::val::BasicBlock*,std::allocator<spvtools::val::BasicBlock*>>const*(spvtools::val::BasicBlock_const*)>)::_lambda(std::pair<spvtools::val::BasicBlock*,spvtools::val::BasicBlock*>const&,std::pair<spvtools::val::BasicBlock*,spvtools::val::BasicBlock*>const&)_1_>>
                (__first,__last,(ulong)(((uint)lVar16 ^ 0x3f) * 2) ^ 0x7e,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ValveSoftware[P]Fossilize_cli_SPIRV_Tools_source_cfa_h:293:7)>
                  )&local_68);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<spvtools::val::BasicBlock*,spvtools::val::BasicBlock*>*,std::vector<std::pair<spvtools::val::BasicBlock*,spvtools::val::BasicBlock*>,std::allocator<std::pair<spvtools::val::BasicBlock*,spvtools::val::BasicBlock*>>>>,__gnu_cxx::__ops::_Iter_comp_iter<spvtools::CFA<spvtools::val::BasicBlock>::CalculateDominators(std::vector<spvtools::val::BasicBlock_const*,std::allocator<spvtools::val::BasicBlock_const*>>const&,std::function<std::vector<spvtools::val::BasicBlock*,std::allocator<spvtools::val::BasicBlock*>>const*(spvtools::val::BasicBlock_const*)>)::_lambda(std::pair<spvtools::val::BasicBlock*,spvtools::val::BasicBlock*>const&,std::pair<spvtools::val::BasicBlock*,spvtools::val::BasicBlock*>const&)_1_>>
                (__first,__last,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ValveSoftware[P]Fossilize_cli_SPIRV_Tools_source_cfa_h:293:7)>
                  )&local_68);
    }
  }
  std::
  _Hashtable<const_spvtools::val::BasicBlock_*,_std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>,_std::allocator<std::pair<const_spvtools::val::BasicBlock_*const,_block_detail>_>,_std::__detail::_Select1st,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::hash<const_spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_68);
  return (vector<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*>_>_>
          *)this;
}

Assistant:

std::vector<std::pair<BB*, BB*>> CFA<BB>::CalculateDominators(
    const std::vector<cbb_ptr>& postorder, get_blocks_func predecessor_func) {
  struct block_detail {
    size_t dominator;  ///< The index of blocks's dominator in post order array
    size_t postorder_index;  ///< The index of the block in the post order array
  };
  const size_t undefined_dom = postorder.size();

  std::unordered_map<cbb_ptr, block_detail> idoms;
  for (size_t i = 0; i < postorder.size(); i++) {
    idoms[postorder[i]] = {undefined_dom, i};
  }
  idoms[postorder.back()].dominator = idoms[postorder.back()].postorder_index;

  bool changed = true;
  while (changed) {
    changed = false;
    for (auto b = postorder.rbegin() + 1; b != postorder.rend(); ++b) {
      const std::vector<BB*>& predecessors = *predecessor_func(*b);
      // Find the first processed/reachable predecessor that is reachable
      // in the forward traversal.
      auto res = std::find_if(std::begin(predecessors), std::end(predecessors),
                              [&idoms, undefined_dom](BB* pred) {
                                return idoms.count(pred) &&
                                       idoms[pred].dominator != undefined_dom;
                              });
      if (res == end(predecessors)) continue;
      const BB* idom = *res;
      size_t idom_idx = idoms[idom].postorder_index;

      // all other predecessors
      for (const auto* p : predecessors) {
        if (idom == p) continue;
        // Only consider nodes reachable in the forward traversal.
        // Otherwise the intersection doesn't make sense and will never
        // terminate.
        if (!idoms.count(p)) continue;
        if (idoms[p].dominator != undefined_dom) {
          size_t finger1 = idoms[p].postorder_index;
          size_t finger2 = idom_idx;
          while (finger1 != finger2) {
            while (finger1 < finger2) {
              finger1 = idoms[postorder[finger1]].dominator;
            }
            while (finger2 < finger1) {
              finger2 = idoms[postorder[finger2]].dominator;
            }
          }
          idom_idx = finger1;
        }
      }
      if (idoms[*b].dominator != idom_idx) {
        idoms[*b].dominator = idom_idx;
        changed = true;
      }
    }
  }

  std::vector<std::pair<bb_ptr, bb_ptr>> out;
  for (auto idom : idoms) {
    // At this point if there is no dominator for the node, just make it
    // reflexive.
    auto dominator = std::get<1>(idom).dominator;
    if (dominator == undefined_dom) {
      dominator = std::get<1>(idom).postorder_index;
    }
    // NOTE: performing a const cast for convenient usage with
    // UpdateImmediateDominators
    out.push_back({const_cast<BB*>(std::get<0>(idom)),
                   const_cast<BB*>(postorder[dominator])});
  }

  // Sort by postorder index to generate a deterministic ordering of edges.
  std::sort(
      out.begin(), out.end(),
      [&idoms](const std::pair<bb_ptr, bb_ptr>& lhs,
               const std::pair<bb_ptr, bb_ptr>& rhs) {
        assert(lhs.first);
        assert(lhs.second);
        assert(rhs.first);
        assert(rhs.second);
        auto lhs_indices = std::make_pair(idoms[lhs.first].postorder_index,
                                          idoms[lhs.second].postorder_index);
        auto rhs_indices = std::make_pair(idoms[rhs.first].postorder_index,
                                          idoms[rhs.second].postorder_index);
        return lhs_indices < rhs_indices;
      });
  return out;
}